

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lysp_resolve_import_include(lysp_ctx *pctx,lysp_module *pmod,ly_set *new_mods)

{
  uint8_t *puVar1;
  lysp_import *mod;
  lysp_import *plVar2;
  LY_ERR LVar3;
  char *revision;
  long lVar4;
  ly_ctx *plVar5;
  ulong uVar6;
  ulong uVar7;
  
  pmod->field_0x79 = pmod->field_0x79 | 1;
  uVar6 = 0;
  do {
    plVar2 = pmod->imports;
    if (plVar2 == (lysp_import *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(plVar2[-1].rev + 6);
    }
    if (uVar7 <= uVar6) {
      LVar3 = lysp_load_submodules(pctx,pmod,new_mods);
      if (LVar3 == LY_SUCCESS) {
        pmod->field_0x79 = pmod->field_0x79 & 0xfe;
        LVar3 = LY_SUCCESS;
      }
      return LVar3;
    }
    mod = plVar2 + uVar6;
    if (plVar2[uVar6].module == (lys_module *)0x0) {
      if (pctx == (lysp_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
      }
      revision = (char *)0x0;
      if (mod->rev[0] != '\0') {
        revision = mod->rev;
      }
      LVar3 = lys_parse_load(plVar5,mod->name,revision,new_mods,&mod->module);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (mod->rev[0] == '\0') {
        puVar1 = &mod->module->latest_revision;
        *puVar1 = *puVar1 | 4;
      }
    }
    if (uVar6 != 0) {
      lVar4 = 0;
      uVar7 = uVar6;
      do {
        if (mod->module == *(lys_module **)(pmod->imports->rev + lVar4 + -0x32)) {
          if (pctx == (lysp_ctx *)0x0) {
            plVar5 = (ly_ctx *)0x0;
          }
          else {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
          }
          ly_log(plVar5,LY_LLWRN,LY_SUCCESS,"Single revision of the module \"%s\" imported twice.",
                 mod->name);
        }
        lVar4 = lVar4 + 0x40;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static LY_ERR
lysp_resolve_import_include(struct lysp_ctx *pctx, struct lysp_module *pmod, struct ly_set *new_mods)
{
    struct lysp_import *imp;
    LY_ARRAY_COUNT_TYPE u, v;

    pmod->parsing = 1;
    LY_ARRAY_FOR(pmod->imports, u) {
        imp = &pmod->imports[u];
        if (!imp->module) {
            LY_CHECK_RET(lys_parse_load(PARSER_CTX(pctx), imp->name, imp->rev[0] ? imp->rev : NULL, new_mods, &imp->module));

            if (!imp->rev[0]) {
                /* This module must be selected for the next similar
                 * import without revision-date to avoid incorrect
                 * derived identities in the ::lys_module.identities.
                 */
                imp->module->latest_revision |= LYS_MOD_IMPORTED_REV;
            }
        }
        /* check for importing the same module twice */
        for (v = 0; v < u; ++v) {
            if (imp->module == pmod->imports[v].module) {
                LOGWRN(PARSER_CTX(pctx), "Single revision of the module \"%s\" imported twice.", imp->name);
            }
        }
    }
    LY_CHECK_RET(lysp_load_submodules(pctx, pmod, new_mods));

    pmod->parsing = 0;

    return LY_SUCCESS;
}